

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O2

Error __thiscall
asmjit::BaseCompiler::_newRegFmt(BaseCompiler *this,BaseReg *out,uint32_t typeId,char *fmt,...)

{
  char in_AL;
  Error EVar1;
  undefined8 name;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  StringTmp<256UL> sb;
  __va_list_tag local_228;
  anon_union_32_4_a21e1b61_for_String_0 local_208;
  char local_1e8 [272];
  undefined1 local_d8 [32];
  undefined8 local_b8;
  undefined8 local_b0;
  undefined4 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  
  local_228.reg_save_area = local_d8;
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Da;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  local_208._large.data = local_1e8;
  local_208._large.size = 0;
  local_208._0_8_ = 0x20;
  local_208._large.capacity = 0x107;
  local_1e8[0] = '\0';
  local_228.gp_offset = 0x20;
  local_228.fp_offset = 0x30;
  local_228.overflow_arg_area = &ap[0].overflow_arg_area;
  local_b8 = in_R8;
  local_b0 = in_R9;
  String::appendVFormat((String *)&local_208._small,fmt,&local_228);
  name = local_208._large.data;
  if (local_208._type < 0x1f) {
    name = local_208._small.data;
  }
  EVar1 = _newReg(this,out,typeId,(char *)name);
  String::reset((String *)&local_208._small);
  return EVar1;
}

Assistant:

Error BaseCompiler::_newRegFmt(BaseReg* out, uint32_t typeId, const char* fmt, ...) {
  va_list ap;
  StringTmp<256> sb;

  va_start(ap, fmt);
  sb.appendVFormat(fmt, ap);
  va_end(ap);

  return _newReg(out, typeId, sb.data());
}